

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.h
# Opt level: O2

void __thiscall vm_bif_desc::init_synth_hdr(vm_bif_desc *this)

{
  this->synth_hdr[0] = '\0';
  this->synth_hdr[1] = '\0';
  this->synth_hdr[2] = '\0';
  this->synth_hdr[3] = '\0';
  this->synth_hdr[4] = '\0';
  this->synth_hdr[5] = '\0';
  this->synth_hdr[6] = '\0';
  this->synth_hdr[7] = '\0';
  this->synth_hdr[8] = '\0';
  this->synth_hdr[9] = '\0';
  this->synth_hdr[0] = (this->varargs != 0) << 7 | (byte)this->min_argc;
  this->synth_hdr[1] = (char)this->opt_argc;
  return;
}

Assistant:

void init_synth_hdr()
    {
        /* set everything to zeros to start with */
        memset(synth_hdr, 0, sizeof(synth_hdr));

        /* 
         *   Fill in the base arguments field.  This is an 8-bit field
         *   containing the minimum number of arguments, with the high bit
         *   (0x80) set if it's varargs.  
         */
        synth_hdr[0] = (char)(min_argc | (varargs ? 0x80 : 0));

        /* set the optional argument count field */
        synth_hdr[1] = (char)opt_argc;

        /*
         *   We can leave all of the other fields zeroed out:
         *   
         *   - locals, total_stack: the caller doesn't allocate a standard
         *   stack frame for a built-in, so these are unused
         *   
         *   - exception_table_ofs: we don't have any bytecode, so we
         *   obviously don't have a bytecode exception table; leave it zeroed
         *   out to indicate the absence of a table
         *   
         *   - debug_ofs: we don't have any debugger information since we
         *   don't have any bytecode; zero indicates no records 
         */
    }